

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

ExprList * sqlite3ExprListAppendGrow(sqlite3 *db,ExprList *pList,Expr *pExpr)

{
  int iVar1;
  ExprList *pEVar2;
  
  iVar1 = pList->nAlloc;
  pList->nAlloc = iVar1 * 2;
  pEVar2 = (ExprList *)sqlite3DbRealloc(db,pList,(long)iVar1 * 0x30 + 8);
  if (pEVar2 == (ExprList *)0x0) {
    if (pList != (ExprList *)0x0) {
      exprListDeleteNN(db,pList);
    }
    if (pExpr != (Expr *)0x0) {
      sqlite3ExprDeleteNN(db,pExpr);
    }
    pEVar2 = (ExprList *)0x0;
  }
  else {
    iVar1 = pEVar2->nExpr;
    pEVar2->nExpr = iVar1 + 1;
    pEVar2->a[iVar1].pExpr = (Expr *)0x0;
    pEVar2->a[iVar1].zEName = (char *)0x0;
    pEVar2->a[iVar1].fg = (anon_struct_4_9_b482b7ef_for_fg)0x0;
    pEVar2->a[iVar1].u = (anon_union_4_2_6146edf4_for_u)0x0;
    pEVar2->a[iVar1].pExpr = pExpr;
  }
  return pEVar2;
}

Assistant:

ExprList *sqlite3ExprListAppendGrow(
  sqlite3 *db,            /* Database handle.  Used for memory allocation */
  ExprList *pList,        /* List to which to append. Might be NULL */
  Expr *pExpr             /* Expression to be appended. Might be NULL */
){
  struct ExprList_item *pItem;
  ExprList *pNew;
  pList->nAlloc *= 2;
  pNew = sqlite3DbRealloc(db, pList,
       sizeof(*pList)+(pList->nAlloc-1)*sizeof(pList->a[0]));
  if( pNew==0 ){
    sqlite3ExprListDelete(db, pList);
    sqlite3ExprDelete(db, pExpr);
    return 0;
  }else{
    pList = pNew;
  }
  pItem = &pList->a[pList->nExpr++];
  *pItem = zeroItem;
  pItem->pExpr = pExpr;
  return pList;
}